

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

void __thiscall BamTools::BamAlignment::RemoveTag(BamAlignment *this,string *tag)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  void *__src;
  RaiiBuffer *in_RDI;
  uint endTagDataLength;
  uint skippedDataLength;
  char *pTagStorageType;
  uint beginningTagDataLength;
  RaiiBuffer newTagData;
  uint numBytesParsed;
  uint newTagDataLength;
  uint originalTagDataLength;
  char *pTagData;
  char *pOriginalTagData;
  uint *in_stack_000000c0;
  char **in_stack_000000c8;
  char in_stack_000000d7;
  BamAlignment *in_stack_000000d8;
  BamAlignment *in_stack_000001f8;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  BamAlignment *in_stack_ffffffffffffffc8;
  
  if (((ulong)in_RDI[0x13].Buffer & 1) != 0) {
    BuildCharData(in_stack_000001f8);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    __src = (void *)std::__cxx11::string::data();
    uVar2 = std::__cxx11::string::size();
    bVar1 = FindTag(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (char **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar1) {
      RaiiBuffer::RaiiBuffer
                ((RaiiBuffer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      uVar3 = 0xfffffffd;
      memcpy(in_stack_ffffffffffffffc0,__src,0xfffffffd);
      bVar1 = SkipToNextTag(in_stack_000000d8,in_stack_000000d7,in_stack_000000c8,in_stack_000000c0)
      ;
      if (bVar1) {
        memcpy(&in_stack_ffffffffffffffc0->_M_dataplus + uVar3,__src,(ulong)uVar2);
        std::__cxx11::string::assign((char *)&in_RDI[8].NumBytes,(ulong)in_stack_ffffffffffffffc0);
      }
      RaiiBuffer::~RaiiBuffer(in_RDI);
    }
  }
  return;
}

Assistant:

void BamAlignment::RemoveTag(const std::string& tag)
{

    // if char data not populated, do that first
    if (SupportData.HasCoreOnly) BuildCharData();

    // skip if no tags available
    if (TagData.empty()) return;

    // localize the tag data
    char* pOriginalTagData = (char*)TagData.data();
    char* pTagData = pOriginalTagData;
    const unsigned int originalTagDataLength = TagData.size();
    unsigned int newTagDataLength = 0;
    unsigned int numBytesParsed = 0;

    // skip if tag not found
    if (!FindTag(tag, pTagData, originalTagDataLength, numBytesParsed)) return;

    // otherwise, remove it
    RaiiBuffer newTagData(originalTagDataLength);

    // copy original tag data up til desired tag
    pTagData -= 3;
    numBytesParsed -= 3;
    const unsigned int beginningTagDataLength = numBytesParsed;
    newTagDataLength += beginningTagDataLength;
    memcpy(newTagData.Buffer, pOriginalTagData, numBytesParsed);

    // attemp to skip to next tag
    const char* pTagStorageType = pTagData + 2;
    pTagData += 3;
    numBytesParsed += 3;
    if (SkipToNextTag(*pTagStorageType, pTagData, numBytesParsed)) {

        // squeeze remaining tag data
        const unsigned int skippedDataLength = (numBytesParsed - beginningTagDataLength);
        const unsigned int endTagDataLength =
            originalTagDataLength - beginningTagDataLength - skippedDataLength;
        memcpy(newTagData.Buffer + beginningTagDataLength, pTagData, endTagDataLength);

        // save modified tag data in alignment
        TagData.assign(newTagData.Buffer, beginningTagDataLength + endTagDataLength);
    }
}